

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O2

Dwarf_Half __thiscall cpptrace::detail::libdwarf::die_object::get_tag(die_object *this)

{
  source_location location;
  int iVar1;
  undefined6 uStack_18;
  Dwarf_Half tag;
  Dwarf_Error local_10;
  
  tag = 0;
  local_10 = (Dwarf_Error)0x0;
  iVar1 = dwarf_tag(this->die,&tag,&local_10);
  if (iVar1 != 1) {
    location.file._6_2_ = tag;
    location.file._0_6_ = uStack_18;
    location._8_8_ = local_10;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x183a77,
                      "Dwarf_Half cpptrace::detail::libdwarf::die_object::get_tag() const",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                      ,location);
    return tag;
  }
  handle_dwarf_error(this->dbg,local_10);
}

Assistant:

Dwarf_Half get_tag() const {
            Dwarf_Half tag = 0;
            VERIFY(wrap(dwarf_tag, die, &tag) == DW_DLV_OK);
            return tag;
        }